

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_8.cpp
# Opt level: O3

int main(void)

{
  undefined8 in_RAX;
  long *plVar1;
  ostream *poVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  uint uVar8;
  long lVar9;
  int n;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::istream::operator>>((istream *)&std::cin,(int *)((long)&uStack_38 + 4));
  num[0] = uStack_38._4_4_;
  lVar4 = 1;
  lVar9 = 0;
  iVar6 = uStack_38._4_4_;
  while( true ) {
    iVar3 = 0;
    if (iVar6 != 0) {
      iVar3 = 0;
      piVar7 = digital;
      iVar5 = iVar6;
      do {
        *piVar7 = iVar5 % 10;
        uVar8 = iVar5 + 9;
        piVar7 = piVar7 + 1;
        iVar3 = iVar3 + 1;
        iVar5 = iVar5 / 10;
      } while (0x12 < uVar8);
    }
    if (digital[0] == (&DAT_0010504c)[iVar3]) break;
    iVar5 = 0;
    iVar3 = iVar6;
    if (iVar6 != 0) {
      do {
        iVar5 = iVar3 % 10 + iVar5 * 10;
        uVar8 = iVar3 + 9;
        iVar3 = iVar3 / 10;
      } while (0x12 < uVar8);
    }
    iVar6 = iVar5 + iVar6;
    uStack_38 = CONCAT44(iVar6,(undefined4)uStack_38);
    num[lVar4] = iVar6;
    lVar4 = lVar4 + 1;
    lVar9 = lVar9 + -1;
  }
  uVar8 = (int)lVar4 - 1;
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar8);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  piVar7 = num;
  do {
    if (lVar9 == 0) {
      plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,num[uVar8]);
      std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
      std::ostream::put((char)plVar1);
      std::ostream::flush();
    }
    else {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"--->",4);
    }
    lVar9 = lVar9 + 1;
    piVar7 = piVar7 + 1;
  } while (lVar9 != 1);
  return 0;
}

Assistant:

int main()
{
    int n,cnt = 0;  //cnt来记录转换加了多少次
    cin  >> n;
    num[cnt++] = n;     //先把这个数存在num当中
    while (!judge(n))
    {
        n += reset(n);
        num[cnt++] = n;
    }
    cout << cnt -1 <<endl;  //cnt-1,要排除这个数本身，才是转换的次数
    for (int i = 0; i < cnt; ++i) {
        if(i != cnt-1 )
        {
            cout << num[i] << "--->";
        }else
            cout << num[i] <<endl;
    }
    return 0;
}